

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cc
# Opt level: O3

int hash_cmp(hash_elem *a,hash_elem *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = *(int *)&a[-1].avl.right;
  iVar1 = *(int *)&b[-1].avl.right;
  uVar3 = 0xffffffff;
  if (iVar1 <= iVar2) {
    uVar3 = (uint)(iVar1 < iVar2);
  }
  return uVar3;
}

Assistant:

int hash_cmp(struct hash_elem *a, struct hash_elem *b)
{
    struct item *aa, *bb;
    aa = _get_entry(a, struct item, e);
    bb = _get_entry(b, struct item, e);
    if (aa->val < bb->val) return -1;
    else if (aa->val > bb->val) return 1;
    else return 0;
}